

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O1

void __thiscall
BamTools::Internal::BamStandardIndex::AdjustRegion
          (BamStandardIndex *this,BamRegion *region,uint32_t *begin,uint32_t *end)

{
  pointer pRVar1;
  RefVector *pRVar2;
  BamException *this_00;
  ulong uVar3;
  ulong uVar4;
  int32_t *piVar5;
  string local_68;
  string local_48;
  
  pRVar2 = BamReaderPrivate::GetReferenceData((this->super_BamIndex).m_reader);
  uVar4 = (ulong)region->LeftRefID;
  pRVar1 = (pRVar2->super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>).
           _M_impl.super__Vector_impl_data._M_start;
  uVar3 = ((long)(pRVar2->super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>)
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1 >> 3) *
          -0x3333333333333333;
  if (uVar4 <= uVar3 && uVar3 - uVar4 != 0) {
    if (pRVar1[uVar4].RefLength <= region->LeftPosition) {
      this_00 = (BamException *)__cxa_allocate_exception(0x28);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"BamStandardIndex::AdjustRegion","");
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"invalid region requested","");
      BamException::BamException(this_00,&local_48,&local_68);
      __cxa_throw(this_00,&BamException::typeinfo,BamException::~BamException);
    }
    *begin = region->LeftPosition;
    if (((region->RightRefID < 0) || (region->RightPosition < 1)) ||
       (region->LeftRefID != region->RightRefID)) {
      uVar4 = (ulong)region->LeftRefID;
      if (uVar3 < uVar4 || uVar3 - uVar4 == 0) goto LAB_0013f717;
      piVar5 = &pRVar1[uVar4].RefLength;
    }
    else {
      piVar5 = &region->RightPosition;
    }
    *end = *piVar5;
    return;
  }
LAB_0013f717:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

void BamStandardIndex::AdjustRegion(const BamRegion& region, uint32_t& begin, uint32_t& end) {

    // retrieve references from reader
    const RefVector& references = m_reader->GetReferenceData();

    // LeftPosition cannot be greater than or equal to reference length
    if ( region.LeftPosition >= references.at(region.LeftRefID).RefLength )
        throw BamException("BamStandardIndex::AdjustRegion", "invalid region requested");

    // set region 'begin'
    begin = (unsigned int)region.LeftPosition;

    // if right bound specified AND left&right bounds are on same reference
    // OK to use right bound position as region 'end'
    if ( region.isRightBoundSpecified() && ( region.LeftRefID == region.RightRefID ) )
        end = (unsigned int)region.RightPosition;

    // otherwise, set region 'end' to last reference base
    else end = (unsigned int)references.at(region.LeftRefID).RefLength;
}